

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall kj::str<signed_char&>(String *__return_storage_ptr__,kj *this,char *params)

{
  char *value;
  CappedArray<char,_5UL> CVar1;
  size_t local_38;
  undefined4 local_30;
  char cStack_2c;
  size_t local_28;
  undefined4 local_20;
  char local_1c;
  kj *local_18;
  char *params_local;
  
  local_18 = this;
  params_local = (char *)__return_storage_ptr__;
  value = fwd<signed_char&>((char *)this);
  CVar1 = toCharSequence<signed_char&>(value);
  local_38 = CVar1.currentSize;
  local_28 = local_38;
  local_30 = CVar1.content._0_4_;
  local_20 = local_30;
  cStack_2c = CVar1.content[4];
  local_1c = cStack_2c;
  _::concat<kj::CappedArray<char,5ul>>(__return_storage_ptr__,(_ *)&local_28,CVar1._8_8_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}